

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# water.cpp
# Opt level: O0

shared_ptr<Histogram> runHistogramStage(Image *previous,WaterEffectOptions *options)

{
  element_type *this;
  long in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  shared_ptr<Histogram> sVar2;
  shared_ptr<Image> hist_img;
  shared_ptr<Histogram> *hist;
  string *in_stack_ffffffffffffff38;
  string local_a0 [8];
  Histogram *in_stack_ffffffffffffff68;
  Image *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  uint in_stack_ffffffffffffffb4;
  Histogram *in_stack_ffffffffffffffb8;
  
  getHistogram(in_stack_ffffffffffffff78);
  std::make_shared<Histogram,Histogram>(in_stack_ffffffffffffff68);
  Histogram::~Histogram((Histogram *)0x11f7dc);
  _Var1._M_pi = extraout_RDX;
  if ((*(byte *)(in_RDX + 0x30) & 1) != 0) {
    std::__shared_ptr_access<Histogram,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<Histogram,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x11f7f8)
    ;
    Histogram::toImage(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4);
    this = std::__shared_ptr_access<Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Image,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x11f816);
    std::operator+(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    std::operator+(in_RDI,(char *)this);
    Image::toPNG(this,in_stack_ffffffffffffff38);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
    std::__cxx11::string::~string(local_a0);
    std::shared_ptr<Image>::~shared_ptr((shared_ptr<Image> *)0x11f87d);
    _Var1._M_pi = extraout_RDX_00;
  }
  sVar2.super___shared_ptr<Histogram,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var1._M_pi;
  sVar2.super___shared_ptr<Histogram,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)in_RDI;
  return (shared_ptr<Histogram>)sVar2.super___shared_ptr<Histogram,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Histogram> runHistogramStage(const Image *previous, const WaterEffectOptions *options) {
  // Obtain the histogram
  auto hist = std::make_shared<Histogram>(getHistogram(previous));

  // Optionally save the intermediate histogram as an image
  if (options->save_intermediate) {
    auto hist_img = hist->toImage();
    hist_img->toPNG("output/" + options->img_name + "_histogram.png");
  }
  return hist;
}